

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPrimalStatus(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Desc *desc,
                 SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base,SPxId *id)

{
  double dVar1;
  Real RVar2;
  int iVar3;
  Status *pSVar4;
  long lVar5;
  bool *pbVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  long lVar11;
  long in_FS_OFFSET;
  byte bVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar12 = 0;
  if ((id->super_DataKey).info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_138,id);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_138);
    lVar11 = (long)iVar3;
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    ::soplex::infinity::__tls_init();
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_138,dVar1);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), -1 < iVar3)) {
      pcVar10 = &(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
      ::soplex::infinity::__tls_init();
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_138,-dVar1);
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
         (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (pcVar10,&local_138), iVar3 < 1)) {
        pSVar4 = (desc->rowstat).data;
        goto LAB_005a497d;
      }
      pSVar4 = (desc->rowstat).data;
      goto LAB_005a493b;
    }
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    ::soplex::infinity::__tls_init();
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_138,-dVar1);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), iVar3 < 1)) {
      pSVar4 = (desc->rowstat).data;
      goto LAB_005a4959;
    }
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    pcVar9 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    RVar2 = Tolerances::epsilon((base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 0x1c;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems[6] = 0;
    local_b8.data._M_elems[7] = 0;
    local_b8.data._M_elems[8] = 0;
    local_b8.data._M_elems[9] = 0;
    local_b8.data._M_elems[10] = 0;
    local_b8.data._M_elems[0xb] = 0;
    local_b8.data._M_elems[0xc] = 0;
    local_b8.data._M_elems[0xd] = 0;
    local_b8.data._M_elems[0xe] = 0;
    local_b8.data._M_elems[0xf] = 0;
    local_b8.data._M_elems[0x10] = 0;
    local_b8.data._M_elems[0x11] = 0;
    local_b8.data._M_elems[0x12] = 0;
    local_b8.data._M_elems[0x13] = 0;
    local_b8.data._M_elems[0x14] = 0;
    local_b8.data._M_elems[0x15] = 0;
    local_b8.data._M_elems[0x16] = 0;
    local_b8.data._M_elems[0x17] = 0;
    local_b8.data._M_elems[0x18] = 0;
    local_b8.data._M_elems[0x19] = 0;
    local_b8.data._M_elems._104_5_ = 0;
    local_b8.data._M_elems[0x1b]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_b8,RVar2);
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    if (&local_138 != pcVar9) {
      pcVar7 = pcVar9;
      pcVar8 = &local_138;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar8->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar12 * -8 + 4);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
      }
      local_138.exp = pcVar9->exp;
      local_138.neg = pcVar9->neg;
      local_138.fpclass = pcVar9->fpclass;
      local_138.prec_elem = pcVar9->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_138,&local_b8);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), -1 < iVar3)) {
      pSVar4 = (desc->rowstat).data;
      goto LAB_005a48fe;
    }
    pbVar6 = (this->rowRight).data;
    pSVar4 = (desc->rowstat).data;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_138,id);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_138);
    lVar11 = (long)iVar3;
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    ::soplex::infinity::__tls_init();
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_138,dVar1);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), -1 < iVar3)) {
      pcVar10 = &(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
      ::soplex::infinity::__tls_init();
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_138,-dVar1);
      if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
         (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (pcVar10,&local_138), iVar3 < 1)) {
        pSVar4 = (desc->colstat).data;
LAB_005a497d:
        pSVar4[lVar11] = P_FREE;
        return;
      }
      pSVar4 = (desc->colstat).data;
      goto LAB_005a493b;
    }
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    ::soplex::infinity::__tls_init();
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_138,-dVar1);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), iVar3 < 1)) {
      pSVar4 = (desc->colstat).data;
      goto LAB_005a4959;
    }
    pcVar10 = &(base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    pcVar9 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
    RVar2 = Tolerances::epsilon((base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 0x1c;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems[6] = 0;
    local_b8.data._M_elems[7] = 0;
    local_b8.data._M_elems[8] = 0;
    local_b8.data._M_elems[9] = 0;
    local_b8.data._M_elems[10] = 0;
    local_b8.data._M_elems[0xb] = 0;
    local_b8.data._M_elems[0xc] = 0;
    local_b8.data._M_elems[0xd] = 0;
    local_b8.data._M_elems[0xe] = 0;
    local_b8.data._M_elems[0xf] = 0;
    local_b8.data._M_elems[0x10] = 0;
    local_b8.data._M_elems[0x11] = 0;
    local_b8.data._M_elems[0x12] = 0;
    local_b8.data._M_elems[0x13] = 0;
    local_b8.data._M_elems[0x14] = 0;
    local_b8.data._M_elems[0x15] = 0;
    local_b8.data._M_elems[0x16] = 0;
    local_b8.data._M_elems[0x17] = 0;
    local_b8.data._M_elems[0x18] = 0;
    local_b8.data._M_elems[0x19] = 0;
    local_b8.data._M_elems._104_5_ = 0;
    local_b8.data._M_elems[0x1b]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_b8,RVar2);
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 0x1c;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.data._M_elems[10] = 0;
    local_138.data._M_elems[0xb] = 0;
    local_138.data._M_elems[0xc] = 0;
    local_138.data._M_elems[0xd] = 0;
    local_138.data._M_elems[0xe] = 0;
    local_138.data._M_elems[0xf] = 0;
    local_138.data._M_elems[0x10] = 0;
    local_138.data._M_elems[0x11] = 0;
    local_138.data._M_elems[0x12] = 0;
    local_138.data._M_elems[0x13] = 0;
    local_138.data._M_elems[0x14] = 0;
    local_138.data._M_elems[0x15] = 0;
    local_138.data._M_elems[0x16] = 0;
    local_138.data._M_elems[0x17] = 0;
    local_138.data._M_elems[0x18] = 0;
    local_138.data._M_elems[0x19] = 0;
    local_138.data._M_elems._104_5_ = 0;
    local_138.data._M_elems[0x1b]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    if (&local_138 != pcVar9) {
      pcVar7 = pcVar9;
      pcVar8 = &local_138;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar8->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar12 * -8 + 4);
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar12 * -8 + 4);
      }
      local_138.exp = pcVar9->exp;
      local_138.neg = pcVar9->neg;
      local_138.fpclass = pcVar9->fpclass;
      local_138.prec_elem = pcVar9->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_138,&local_b8);
    if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)) &&
       (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar10,&local_138), -1 < iVar3)) {
      pSVar4 = (desc->colstat).data;
LAB_005a48fe:
      pSVar4[lVar11] = P_FIXED;
      return;
    }
    pbVar6 = (this->colUp).data;
    pSVar4 = (desc->colstat).data;
  }
  if (pbVar6[lVar11] == true) {
LAB_005a4959:
    pSVar4[lVar11] = P_ON_UPPER;
    return;
  }
LAB_005a493b:
  pSVar4[lVar11] = P_ON_LOWER;
  return;
}

Assistant:

void SPxWeightST<R>::setPrimalStatus(
   typename SPxBasisBase<R>::Desc& desc,
   const SPxSolverBase<R>& base,
   const SPxId& id)
{
   if(id.isSPxRowId())
   {
      int n = base.number(SPxRowId(id));

      if(base.rhs(n) >= R(infinity))
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.lhs(n) >= base.rhs(n) - base.epsilon())
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(rowRight[n])
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
   else
   {
      int n = base.number(SPxColId(id));

      if(base.SPxLPBase<R>::upper(n) >= R(infinity))
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.SPxLPBase<R>::lower(n) >= base.SPxLPBase<R>::upper(n) - base.epsilon())
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(colUp[n])
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
}